

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O2

CType google::protobuf::internal::cpp::
      EffectiveStringCType<google::protobuf::FieldDescriptor,google::protobuf::FieldOptions>
                (FieldDescriptor *field)

{
  CppStringType CVar1;
  
  CVar1 = FieldDescriptor::cpp_string_type(field);
  return (CType)(CVar1 == kCord);
}

Assistant:

typename FieldOpts::CType EffectiveStringCType(const FieldDesc* field) {
  // TODO Replace this function with
  // FieldDescriptor::cpp_string_type;
  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord:
      return FieldOpts::CORD;
    default:
      return FieldOpts::STRING;
  }
}